

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O0

rtc * __thiscall
rtc::hex_encode_with_delimiter_abi_cxx11_(rtc *this,char *source,size_t srclen,char delimiter)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  allocator *paVar4;
  FatalMessage *this_00;
  rtc *this_01;
  ostream *poVar5;
  undefined8 uStack_230;
  char *local_228;
  size_t local_220;
  allocator *local_218;
  ostream *local_210;
  ostream *local_208;
  ostream *local_200;
  FatalMessage *local_1f8;
  ostream *local_1f0;
  rtc *local_1e8;
  rtc *local_1e0;
  allocator local_1d5 [20];
  byte local_1c1;
  FatalMessage local_1c0;
  FatalMessageVoidify local_41;
  size_t local_40;
  size_t length;
  char *buffer;
  size_t kBufferSize;
  size_t sStack_20;
  char delimiter_local;
  size_t srclen_local;
  char *source_local;
  
  pcVar2 = (char *)(srclen * 3);
  lVar1 = -((ulong)(pcVar2 + 0xf) & 0xfffffffffffffff0);
  local_1e8 = this;
  local_1e0 = this;
  length = (size_t)((long)&local_228 + lVar1);
  buffer = pcVar2;
  kBufferSize._7_1_ = delimiter;
  sStack_20 = srclen;
  srclen_local = (size_t)source;
  source_local = (char *)this;
  *(undefined8 *)((long)&uStack_230 + lVar1) = 0x1c3a4c;
  local_40 = hex_encode_with_delimiter
                       ((char *)((long)&local_228 + lVar1),(size_t)pcVar2,source,srclen,delimiter);
  local_1c1 = 0;
  if ((sStack_20 != 0) && (local_40 == 0)) {
    *(undefined8 *)((long)&uStack_230 + lVar1) = 0x1c3a76;
    FatalMessageVoidify::FatalMessageVoidify(&local_41);
    local_1f8 = &local_1c0;
    *(undefined8 *)((long)&uStack_230 + lVar1) = 0x1c3a95;
    FatalMessage::FatalMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/stringencode.cc"
               ,0x1e3);
    this_00 = local_1f8;
    local_1c1 = 1;
    *(undefined8 *)((long)&uStack_230 + lVar1) = 0x1c3aa8;
    poVar5 = FatalMessage::stream(this_00);
    local_1f0 = poVar5;
    *(undefined8 *)((long)&uStack_230 + lVar1) = 0x1c3ac4;
    poVar5 = std::operator<<(poVar5,"Check failed: srclen == 0 || length > 0");
    local_200 = poVar5;
    *(undefined8 *)((long)&uStack_230 + lVar1) = 0x1c3ae0;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_208 = poVar5;
    *(undefined8 *)((long)&uStack_230 + lVar1) = 0x1c3afc;
    poVar5 = std::operator<<(poVar5,"# ");
    local_210 = poVar5;
    *(undefined8 *)((long)&uStack_230 + lVar1) = 0x1c3b15;
    FatalMessageVoidify::operator&(&local_41,poVar5);
  }
  if ((local_1c1 & 1) != 0) {
    *(undefined1 **)((long)&uStack_230 + lVar1) = &LAB_001c3b30;
    FatalMessage::~FatalMessage(&local_1c0);
  }
  local_228 = (char *)length;
  local_220 = local_40;
  local_218 = local_1d5;
  *(undefined8 *)((long)&uStack_230 + lVar1) = 0x1c3b76;
  std::allocator<char>::allocator();
  this_01 = local_1e8;
  paVar4 = local_218;
  sVar3 = local_220;
  pcVar2 = local_228;
  *(undefined8 *)((long)&uStack_230 + lVar1) = 0x1c3b97;
  std::__cxx11::string::string((string *)this_01,pcVar2,sVar3,paVar4);
  *(undefined8 *)((long)&uStack_230 + lVar1) = 0x1c3ba5;
  std::allocator<char>::~allocator((allocator<char> *)local_1d5);
  return local_1e0;
}

Assistant:

std::string hex_encode_with_delimiter(const char* source, size_t srclen,
                                      char delimiter) {
  const size_t kBufferSize = srclen * 3;
  char* buffer = STACK_ARRAY(char, kBufferSize);
  size_t length = hex_encode_with_delimiter(buffer, kBufferSize,
                                            source, srclen, delimiter);
  RTC_DCHECK(srclen == 0 || length > 0);
  return std::string(buffer, length);
}